

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusivePublication.cpp
# Opt level: O0

void __thiscall
aeron::ExclusivePublication::ExclusivePublication
          (ExclusivePublication *this,ClientConductor *conductor,string *channel,
          int64_t registrationId,int64_t originalRegistrationId,int32_t streamId,int32_t sessionId,
          UnsafeBufferPosition *publicationLimit,int32_t channelStatusId,
          shared_ptr<aeron::LogBuffers> *logBuffers)

{
  index_t iVar1;
  int32_t iVar2;
  int iVar3;
  element_type *peVar4;
  AtomicBuffer *pAVar5;
  pointer this_00;
  int64_t iVar6;
  undefined8 in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000018;
  int64_t rawTail;
  int i;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  AtomicBuffer *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  ExclusiveTermAppender *in_stack_fffffffffffffea0;
  undefined8 *local_100;
  int local_5c;
  AtomicBuffer local_58;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_20;
  string *local_18;
  
  *in_RDI = &PTR__ExclusivePublication_00225c90;
  in_RDI[1] = in_RSI;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ea531);
  pAVar5 = LogBuffers::atomicBuffer(peVar4,3);
  in_RDI[2] = pAVar5;
  std::__cxx11::string::string((string *)(in_RDI + 3),local_18);
  in_RDI[7] = local_20;
  in_RDI[8] = local_28;
  peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ea59c);
  pAVar5 = LogBuffers::atomicBuffer(peVar4,0);
  iVar1 = concurrent::AtomicBuffer::capacity(pAVar5);
  in_RDI[9] = (long)iVar1 << 0x1f;
  *(undefined4 *)(in_RDI + 10) = local_2c;
  *(undefined4 *)((long)in_RDI + 0x54) = in_stack_00000008;
  iVar2 = concurrent::logbuffer::LogBufferDescriptor::initialTermId((AtomicBuffer *)0x1ea613);
  *(int32_t *)(in_RDI + 0xb) = iVar2;
  iVar2 = concurrent::logbuffer::LogBufferDescriptor::mtuLength((AtomicBuffer *)0x1ea64d);
  *(int32_t *)((long)in_RDI + 0x5c) = iVar2 + -0x20;
  peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ea68b);
  pAVar5 = LogBuffers::atomicBuffer(peVar4,0);
  concurrent::AtomicBuffer::capacity(pAVar5);
  iVar1 = concurrent::logbuffer::FrameDescriptor::computeMaxMessageLength(0);
  *(index_t *)(in_RDI + 0xc) = iVar1;
  peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ea6fc);
  pAVar5 = LogBuffers::atomicBuffer(peVar4,0);
  iVar1 = concurrent::AtomicBuffer::capacity(pAVar5);
  iVar3 = util::BitUtil::numberOfTrailingZeroes<int>(iVar1);
  *(int *)((long)in_RDI + 100) = iVar3;
  iVar2 = concurrent::logbuffer::LogBufferDescriptor::activeTermCount((AtomicBuffer *)0x1ea75e);
  iVar3 = concurrent::logbuffer::LogBufferDescriptor::indexByTermCount((long)iVar2);
  *(int *)(in_RDI + 0xe) = iVar3;
  concurrent::status::ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>::
  ReadablePosition((ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition> *)
                   in_stack_fffffffffffffe90,
                   (UnsafeBufferPosition *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  *(undefined4 *)(in_RDI + 0x14) = in_stack_00000018;
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_fffffffffffffe90,
             SUB41((uint)in_stack_fffffffffffffe8c >> 0x18,0));
  std::shared_ptr<aeron::LogBuffers>::shared_ptr
            ((shared_ptr<aeron::LogBuffers> *)in_stack_fffffffffffffe90,
             (shared_ptr<aeron::LogBuffers> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_100 = in_RDI + 0x17;
  do {
    std::
    unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>>
    ::unique_ptr<std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>,void>
              ((unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                *)in_stack_fffffffffffffe90);
    local_100 = local_100 + 1;
  } while (local_100 != in_RDI + 0x1a);
  concurrent::logbuffer::LogBufferDescriptor::defaultFrameHeader
            ((AtomicBuffer *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  concurrent::logbuffer::HeaderWriter::HeaderWriter
            ((HeaderWriter *)in_stack_fffffffffffffea0,
             (AtomicBuffer *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  concurrent::AtomicBuffer::~AtomicBuffer(&local_58);
  for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
    operator_new(0x10);
    peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1ea8b6);
    LogBuffers::atomicBuffer(peVar4,local_5c);
    peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1ea8d9);
    LogBuffers::atomicBuffer(peVar4,3);
    concurrent::logbuffer::ExclusiveTermAppender::ExclusiveTermAppender
              (in_stack_fffffffffffffea0,
               (AtomicBuffer *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    std::
    unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>>
    ::unique_ptr<std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>,void>
              ((unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                *)in_stack_fffffffffffffe90,
               (pointer)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::
    unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
    ::operator=((unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                 *)in_stack_fffffffffffffe90,
                (unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::
    unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
    ::~unique_ptr((unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                   *)in_stack_fffffffffffffe90);
  }
  this_00 = std::
            unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
            ::operator->((unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                          *)(in_RDI + (long)*(int *)(in_RDI + 0xe) + 0x17));
  iVar6 = concurrent::logbuffer::ExclusiveTermAppender::rawTail(this_00);
  iVar2 = concurrent::logbuffer::LogBufferDescriptor::termId(iVar6);
  *(int32_t *)((long)in_RDI + 0x74) = iVar2;
  peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1eaa56);
  pAVar5 = LogBuffers::atomicBuffer(peVar4,0);
  concurrent::AtomicBuffer::capacity(pAVar5);
  iVar2 = concurrent::logbuffer::LogBufferDescriptor::termOffset
                    ((int64_t)in_stack_fffffffffffffe90,
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  *(int32_t *)(in_RDI + 0xf) = iVar2;
  iVar6 = concurrent::logbuffer::LogBufferDescriptor::computeTermBeginPosition
                    (*(int32_t *)((long)in_RDI + 0x74),*(int32_t *)((long)in_RDI + 100),
                     *(int32_t *)(in_RDI + 0xb));
  in_RDI[0xd] = iVar6;
  return;
}

Assistant:

ExclusivePublication::ExclusivePublication(
    ClientConductor &conductor,
    const std::string &channel,
    std::int64_t registrationId,
    std::int64_t originalRegistrationId,
    std::int32_t streamId,
    std::int32_t sessionId,
    UnsafeBufferPosition& publicationLimit,
    std::int32_t channelStatusId,
    std::shared_ptr<LogBuffers> logBuffers)
    :
    m_conductor(conductor),
    m_logMetaDataBuffer(logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX)),
    m_channel(channel),
    m_registrationId(registrationId),
    m_originalRegistrationId(originalRegistrationId),
    m_maxPossiblePosition(static_cast<int64_t>(logBuffers->atomicBuffer(0).capacity()) << 31),
    m_streamId(streamId),
    m_sessionId(sessionId),
    m_initialTermId(LogBufferDescriptor::initialTermId(m_logMetaDataBuffer)),
    m_maxPayloadLength(LogBufferDescriptor::mtuLength(m_logMetaDataBuffer) - DataFrameHeader::LENGTH),
    m_maxMessageLength(FrameDescriptor::computeMaxMessageLength(logBuffers->atomicBuffer(0).capacity())),
    m_positionBitsToShift(util::BitUtil::numberOfTrailingZeroes(logBuffers->atomicBuffer(0).capacity())),
    m_activePartitionIndex(LogBufferDescriptor::indexByTermCount(LogBufferDescriptor::activeTermCount(m_logMetaDataBuffer))),
    m_publicationLimit(publicationLimit),
    m_channelStatusId(channelStatusId),
    m_logBuffers(logBuffers),
    m_headerWriter(LogBufferDescriptor::defaultFrameHeader(m_logMetaDataBuffer))
{
    for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
    {
        /*
         * TODO:
         * perhaps allow copy-construction and be able to move appenders and AtomicBuffers directly into Publication for
         * locality.
         */
        m_appenders[i] = std::unique_ptr<ExclusiveTermAppender>(new ExclusiveTermAppender(
            logBuffers->atomicBuffer(i),
            logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX),
            i));
    }

    const std::int64_t rawTail = m_appenders[m_activePartitionIndex]->rawTail();
    m_termId = LogBufferDescriptor::termId(rawTail);
    m_termOffset = LogBufferDescriptor::termOffset(rawTail, logBuffers->atomicBuffer(0).capacity());
    m_termBeginPosition = LogBufferDescriptor::computeTermBeginPosition(m_termId, m_positionBitsToShift, m_initialTermId);
}